

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O1

void Test_Template_SetMarkerDelimiters::Run(void)

{
  char *pcVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  Template *pTVar4;
  TemplateDictionary dict;
  undefined1 local_f0 [32];
  char *local_d0;
  undefined8 uStack_c8;
  undefined1 local_c0;
  undefined7 uStack_bf;
  undefined8 uStack_b8;
  char *local_b0;
  undefined8 uStack_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  undefined8 uStack_98;
  TemplateDictionary local_90 [112];
  
  local_f0._0_8_ = "dict";
  local_f0._8_8_ = 4;
  local_f0[0x10] = true;
  local_f0._24_8_ = 0;
  ctemplate::TemplateDictionary::TemplateDictionary
            (local_90,(TemplateString *)local_f0,(UnsafeArena *)0x0);
  local_b0 = "VAR";
  uStack_a8 = 3;
  local_a0 = 1;
  uStack_98 = 0;
  local_d0 = "yo";
  uStack_c8 = 2;
  local_c0 = 1;
  uStack_b8 = 0;
  TVar3._17_7_ = uStack_bf;
  TVar3.is_immutable_ = true;
  TVar2._17_7_ = uStack_9f;
  TVar2.is_immutable_ = true;
  TVar2.length_ = 3;
  TVar2.ptr_ = "VAR";
  TVar2.id_ = 0;
  TVar3.length_ = 2;
  TVar3.ptr_ = "yo";
  TVar3.id_ = 0;
  ctemplate::TemplateDictionary::SetValue(TVar2,TVar3);
  pcVar1 = local_f0 + 0x10;
  local_f0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,"{{=| |=}}\nhi |VAR| {{lo}}","");
  pTVar4 = ctemplate::StringToTemplate((string *)local_f0,STRIP_WHITESPACE);
  if ((char *)local_f0._0_8_ != pcVar1) {
    operator_delete((void *)local_f0._0_8_);
  }
  local_f0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"hi yo {{lo}}","");
  ctemplate::AssertExpandIs(pTVar4,local_90,(string *)local_f0,true);
  if ((char *)local_f0._0_8_ != pcVar1) {
    operator_delete((void *)local_f0._0_8_);
  }
  local_f0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"{{=| |=}}hi |VAR| {{lo}}","");
  pTVar4 = ctemplate::StringToTemplate((string *)local_f0,STRIP_WHITESPACE);
  if ((char *)local_f0._0_8_ != pcVar1) {
    operator_delete((void *)local_f0._0_8_);
  }
  local_f0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"hi yo {{lo}}","");
  ctemplate::AssertExpandIs(pTVar4,local_90,(string *)local_f0,true);
  if ((char *)local_f0._0_8_ != pcVar1) {
    operator_delete((void *)local_f0._0_8_);
  }
  local_f0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,"{{=| ||=}}hi ||VAR|||VAR|| {{lo}}","");
  pTVar4 = ctemplate::StringToTemplate((string *)local_f0,STRIP_WHITESPACE);
  if ((char *)local_f0._0_8_ != pcVar1) {
    operator_delete((void *)local_f0._0_8_);
  }
  local_f0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"hi |yoyo {{lo}}","");
  ctemplate::AssertExpandIs(pTVar4,local_90,(string *)local_f0,true);
  if ((char *)local_f0._0_8_ != pcVar1) {
    operator_delete((void *)local_f0._0_8_);
  }
  local_f0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,"{{=< >=}}hi <<VAR>> {{lo}}","");
  pTVar4 = ctemplate::StringToTemplate((string *)local_f0,STRIP_WHITESPACE);
  if ((char *)local_f0._0_8_ != pcVar1) {
    operator_delete((void *)local_f0._0_8_);
  }
  local_f0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"hi <yo> {{lo}}","");
  ctemplate::AssertExpandIs(pTVar4,local_90,(string *)local_f0,true);
  if ((char *)local_f0._0_8_ != pcVar1) {
    operator_delete((void *)local_f0._0_8_);
  }
  local_f0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,"{{=<< >>=}}hi <<VAR>> {{lo}}","");
  pTVar4 = ctemplate::StringToTemplate((string *)local_f0,STRIP_WHITESPACE);
  if ((char *)local_f0._0_8_ != pcVar1) {
    operator_delete((void *)local_f0._0_8_);
  }
  local_f0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"hi yo {{lo}}","");
  ctemplate::AssertExpandIs(pTVar4,local_90,(string *)local_f0,true);
  if ((char *)local_f0._0_8_ != pcVar1) {
    operator_delete((void *)local_f0._0_8_);
  }
  local_f0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,"{{=<< <<=}}hi <<VAR<< {{lo}}","");
  pTVar4 = ctemplate::StringToTemplate((string *)local_f0,STRIP_WHITESPACE);
  if ((char *)local_f0._0_8_ != pcVar1) {
    operator_delete((void *)local_f0._0_8_);
  }
  local_f0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"hi yo {{lo}}","");
  ctemplate::AssertExpandIs(pTVar4,local_90,(string *)local_f0,true);
  if ((char *)local_f0._0_8_ != pcVar1) {
    operator_delete((void *)local_f0._0_8_);
  }
  local_f0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,
             "hi {{VAR}} lo\n{{=< >=}}\nhi {{VAR}} lo\nhi <VAR> lo\n<={ }=>\nhi {{VAR}} lo\n{={{ }}=}\nhi {{VAR}} lo\n"
             ,"");
  pTVar4 = ctemplate::StringToTemplate((string *)local_f0,STRIP_WHITESPACE);
  if ((char *)local_f0._0_8_ != pcVar1) {
    operator_delete((void *)local_f0._0_8_);
  }
  local_f0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,"hi yo lohi {{VAR}} lohi yo lohi {yo} lohi yo lo","");
  ctemplate::AssertExpandIs(pTVar4,local_90,(string *)local_f0,true);
  if ((char *)local_f0._0_8_ != pcVar1) {
    operator_delete((void *)local_f0._0_8_);
  }
  local_f0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"hi {{VAR}} lo\n{{=< >}}\n","")
  ;
  pTVar4 = ctemplate::StringToTemplate((string *)local_f0,STRIP_WHITESPACE);
  if ((char *)local_f0._0_8_ != pcVar1) {
    operator_delete((void *)local_f0._0_8_);
  }
  if (pTVar4 != (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x25a,"tpl6 == NULL");
    __assert_fail("tpl6 == __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x25a,"static void Test_Template_SetMarkerDelimiters::Run()");
  }
  local_f0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"hi {{VAR}} lo\n{{=<>}}\n","");
  pTVar4 = ctemplate::StringToTemplate((string *)local_f0,STRIP_WHITESPACE);
  if ((char *)local_f0._0_8_ != pcVar1) {
    operator_delete((void *)local_f0._0_8_);
  }
  if (pTVar4 != (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x25e,"tpl7 == NULL");
    __assert_fail("tpl7 == __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x25e,"static void Test_Template_SetMarkerDelimiters::Run()");
  }
  local_f0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_f0,"hi {{VAR}} lo\n{{=<  >=}}\n","");
  pTVar4 = ctemplate::StringToTemplate((string *)local_f0,STRIP_WHITESPACE);
  if ((char *)local_f0._0_8_ != pcVar1) {
    operator_delete((void *)local_f0._0_8_);
  }
  if (pTVar4 != (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x262,"tpl8 == NULL");
    __assert_fail("tpl8 == __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x262,"static void Test_Template_SetMarkerDelimiters::Run()");
  }
  local_f0._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"hi {{VAR}} lo\n{{==}}\n","");
  pTVar4 = ctemplate::StringToTemplate((string *)local_f0,STRIP_WHITESPACE);
  if ((char *)local_f0._0_8_ != pcVar1) {
    operator_delete((void *)local_f0._0_8_);
  }
  if (pTVar4 == (Template *)0x0) {
    local_f0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"hi {{VAR}} lo\n{{=}}\n","");
    pTVar4 = ctemplate::StringToTemplate((string *)local_f0,STRIP_WHITESPACE);
    if ((char *)local_f0._0_8_ != pcVar1) {
      operator_delete((void *)local_f0._0_8_);
    }
    if (pTVar4 == (Template *)0x0) {
      local_f0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f0,"line\n  {{=| |=}} \nhi |VAR| {{lo}}\n","");
      pTVar4 = ctemplate::StringToTemplate((string *)local_f0,STRIP_BLANK_LINES);
      if ((char *)local_f0._0_8_ != pcVar1) {
        operator_delete((void *)local_f0._0_8_);
      }
      local_f0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"line\nhi yo {{lo}}\n","");
      ctemplate::AssertExpandIs(pTVar4,local_90,(string *)local_f0,true);
      if ((char *)local_f0._0_8_ != pcVar1) {
        operator_delete((void *)local_f0._0_8_);
      }
      local_f0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_f0,
                 "  {{#SEC1}}  \n{{=| |=}}    |VAR|\n  |/SEC1|\ntada! |VAR|\nhello|=<< >>=|\n   <<! a blank line>>  \ndone"
                 ,"");
      pTVar4 = ctemplate::StringToTemplate((string *)local_f0,STRIP_BLANK_LINES);
      if ((char *)local_f0._0_8_ != pcVar1) {
        operator_delete((void *)local_f0._0_8_);
      }
      local_f0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_f0,"tada! yo\nhello\ndone","")
      ;
      ctemplate::AssertExpandIs(pTVar4,local_90,(string *)local_f0,true);
      if ((char *)local_f0._0_8_ != pcVar1) {
        operator_delete((void *)local_f0._0_8_);
      }
      ctemplate::TemplateDictionary::~TemplateDictionary(local_90);
      return;
    }
    printf("ASSERT FAILED, line %d: %s\n",0x26a,"tpl10 == NULL");
    __assert_fail("tpl10 == __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x26a,"static void Test_Template_SetMarkerDelimiters::Run()");
  }
  printf("ASSERT FAILED, line %d: %s\n",0x266,"tpl9 == NULL");
  __assert_fail("tpl9 == __null",
                "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                ,0x266,"static void Test_Template_SetMarkerDelimiters::Run()");
}

Assistant:

bool IntEqVerbose(int a, int b) {
  if (a != b) {
    printf("EXPECTED: %d\n", a);
    printf("ACTUAL: %d\n", b);
    return false;
  }
  return true;
}